

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3Fts5IterClose(Fts5IndexIter *pIndexIter)

{
  long lVar1;
  sqlite3_blob *pBlob;
  
  if (pIndexIter != (Fts5IndexIter *)0x0) {
    lVar1 = pIndexIter[1].iRowid;
    fts5MultiIterFree((Fts5Iter *)pIndexIter);
    pBlob = *(sqlite3_blob **)(lVar1 + 0x38);
    if (pBlob != (sqlite3_blob *)0x0) {
      *(undefined8 *)(lVar1 + 0x38) = 0;
      sqlite3_blob_close(pBlob);
      return;
    }
  }
  return;
}

Assistant:

static void sqlite3Fts5IterClose(Fts5IndexIter *pIndexIter){
  if( pIndexIter ){
    Fts5Iter *pIter = (Fts5Iter*)pIndexIter;
    Fts5Index *pIndex = pIter->pIndex;
    fts5MultiIterFree(pIter);
    fts5CloseReader(pIndex);
  }
}